

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

void cJSON_ReplaceItemInObject(cJSON *object,char *string,cJSON *newitem)

{
  int iVar1;
  char *pcVar2;
  int which;
  cJSON *pcVar3;
  
  pcVar3 = (cJSON *)&object->child;
  which = 0;
  while( true ) {
    pcVar3 = pcVar3->next;
    if (pcVar3 == (cJSON *)0x0) {
      return;
    }
    iVar1 = cJSON_strcasecmp(pcVar3->string,string);
    if (iVar1 == 0) break;
    which = which + 1;
  }
  pcVar2 = cJSON_strdup(string);
  newitem->string = pcVar2;
  cJSON_ReplaceItemInArray(object,which,newitem);
  return;
}

Assistant:

void   cJSON_ReplaceItemInObject(cJSON *object,const char *string,cJSON *newitem){int i=0;cJSON *c=object->child;while(c && cJSON_strcasecmp(c->string,string))i++,c=c->next;if(c){newitem->string=cJSON_strdup(string);cJSON_ReplaceItemInArray(object,i,newitem);}}